

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O2

aspa_status
aspa_table_update_in_place
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update_operation **failed_operation)

{
  aspa_record *record;
  aspa_update_operation *paVar1;
  aspa_update_operation *paVar2;
  aspa_array *array;
  size_t __nmemb;
  uint32_t *__base;
  aspa_status aVar3;
  aspa_store_node *paVar4;
  aspa_record *paVar5;
  aspa_update_operation *paVar6;
  ulong uVar7;
  ulong index;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  aspa_array *a;
  aspa_store_node **node;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x268,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x269,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (failed_operation == (aspa_update_operation **)0x0) {
    __assert_fail("failed_operation",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x26a,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (count == 0 || operations == (aspa_update_operation *)0x0) {
    aVar3 = -(uint)(operations == (aspa_update_operation *)0x0 && count != 0);
  }
  else {
    qsort(operations,count,0x30,compare_update_operations);
    pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
    node = aspa_store_get_node(&aspa_table->store,rtr_socket);
    if ((node != (aspa_store_node **)0x0) && (paVar4 = *node, paVar4 != (aspa_store_node *)0x0)) {
LAB_0010ce80:
      array = paVar4->aspa_array;
      if (array == (aspa_array *)0x0) {
        __assert_fail("(*node)->aspa_array",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                      ,0x28b,
                      "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                     );
      }
      aspa_array_reserve(array,array->size + count);
      index = 0;
      uVar7 = 0;
LAB_0010ceb8:
      do {
        if (count <= uVar7) goto LAB_0010d0aa;
        paVar2 = operations + uVar7 + 1;
        paVar6 = (aspa_update_operation *)0x0;
        if (uVar7 < count - 1) {
          paVar6 = paVar2;
        }
        paVar1 = operations + uVar7;
        __nmemb = paVar2[-1].record.provider_count;
        if (paVar2[-1].type == ASPA_REMOVE) {
          if (__nmemb != 0) {
            __assert_fail("current->record.provider_count == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                          ,0x29a,
                          "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                         );
          }
          if ((paVar1->record).provider_asns != (uint32_t *)0x0) {
            __assert_fail("!current->record.provider_asns",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                          ,0x29b,
                          "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                         );
          }
        }
        else if ((__nmemb != 0) &&
                (__base = (paVar1->record).provider_asns, __base != (uint32_t *)0x0)) {
          qsort(__base,__nmemb,4,compare_asns);
        }
        record = &paVar1->record;
        while ((index < array->size &&
               (paVar5 = aspa_array_get_record(array,index),
               paVar5->customer_asn < record->customer_asn))) {
          index = index + 1;
        }
        paVar5 = aspa_array_get_record(array,index);
        if (paVar5 == (aspa_record *)0x0) {
          bVar8 = false;
        }
        else {
          bVar8 = paVar5->customer_asn == record->customer_asn;
        }
        if (uVar7 < count - 1) {
          bVar9 = (paVar2->record).customer_asn == record->customer_asn;
        }
        else {
          bVar9 = false;
        }
        if (paVar1->type == ASPA_REMOVE) {
          if (bVar8) {
            (paVar1->record).provider_count = paVar5->provider_count;
            (paVar1->record).provider_asns = paVar5->provider_asns;
            aVar3 = aspa_array_remove(array,index,false);
            if (aVar3 == ASPA_SUCCESS) goto LAB_0010cfef;
          }
          *failed_operation = paVar1;
          pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
          aVar3 = ASPA_RECORD_NOT_FOUND;
          goto LAB_0010d103;
        }
        if (paVar1->type == ASPA_ADD) {
          if (bVar8) {
            *failed_operation = paVar1;
            pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
            aVar3 = ASPA_DUPLICATE_RECORD;
            goto LAB_0010d103;
          }
          if ((bVar9) && (paVar6->type == ASPA_REMOVE)) {
            paVar1->is_no_op = true;
            paVar6->is_no_op = true;
            uVar7 = uVar7 + 2;
            goto LAB_0010ceb8;
          }
          aVar3 = aspa_array_insert(array,index,record,true);
          if (aVar3 != ASPA_SUCCESS) {
            *failed_operation = paVar1;
            goto LAB_0010d0f7;
          }
        }
LAB_0010cfef:
        aspa_table_notify_clients(aspa_table,record,rtr_socket,paVar1->type);
        uVar7 = uVar7 + 1;
      } while( true );
    }
    a = (aspa_array *)0x0;
    aVar3 = aspa_array_create(&a);
    if (aVar3 == ASPA_SUCCESS) {
      aVar3 = aspa_store_create_node(&aspa_table->store,rtr_socket,a,&node);
      if ((node != (aspa_store_node **)0x0 && aVar3 == ASPA_SUCCESS) &&
         (*node != (aspa_store_node *)0x0)) {
        paVar4 = *node;
        if (paVar4 == (aspa_store_node *)0x0) {
          __assert_fail("*node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x28a,
                        "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                       );
        }
        goto LAB_0010ce80;
      }
      aspa_array_free(a,false);
LAB_0010d0f7:
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    }
    aVar3 = ASPA_ERROR;
  }
LAB_0010d103:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return aVar3;
LAB_0010d0aa:
  pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
  aVar3 = ASPA_SUCCESS;
  goto LAB_0010d103;
}

Assistant:

enum aspa_status aspa_table_update_in_place(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
					    struct aspa_update_operation *operations, size_t count,
					    struct aspa_update_operation **failed_operation)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);
	assert(failed_operation);

	if (!aspa_table || !rtr_socket || !failed_operation || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	// stable sort operations, so operations dealing with the same customer ASN
	// are located right next to each other
	qsort(operations, count, sizeof(struct aspa_update_operation), compare_update_operations);

	pthread_rwlock_wrlock(&aspa_table->lock);
	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	if (!node || !*node) {
		// The given table doesn't have a node for that socket, so create one
		struct aspa_array *a = NULL;

		if (aspa_array_create(&a) != ASPA_SUCCESS)
			return ASPA_ERROR;

		// Insert into table
		if (aspa_store_create_node(&aspa_table->store, rtr_socket, a, &node) != ASPA_SUCCESS || !node ||
		    !*node) {
			aspa_array_free(a, false);
			pthread_rwlock_unlock(&aspa_table->lock);
			return ASPA_ERROR;
		}
	}

	assert(node);
	assert(*node);
	assert((*node)->aspa_array);

	struct aspa_array *array = (*node)->aspa_array;
	size_t existing_i = 0;

	// preemptively allocating enough space
	aspa_array_reserve(array, count + array->size);

	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *current = &operations[i];
		struct aspa_update_operation *next = (i < count - 1) ? &(operations[i + 1]) : NULL;

#ifndef NDEBUG
		// Sanity check record
		if (current->type == ASPA_REMOVE) {
			assert(current->record.provider_count == 0);
			assert(!current->record.provider_asns);
		}
#endif

		// Sort providers.
		// We consider this an implementation detail, callers must not make any assumptions on the
		// ordering of provider ASNs.
		if (current->record.provider_count > 0 && current->record.provider_asns)
			qsort(current->record.provider_asns, current->record.provider_count, sizeof(uint32_t),
			      compare_asns);

		while (existing_i < array->size &&
		       aspa_array_get_record(array, existing_i)->customer_asn < current->record.customer_asn) {
			existing_i += 1;
		}

		struct aspa_record *existing_record = aspa_array_get_record(array, existing_i);

		// existing record and current op have matching CAS
		bool existing_matches_current = existing_record &&
						existing_record->customer_asn == current->record.customer_asn;

		// next record and current op have matching CAS
		bool next_matches_current = next && next->record.customer_asn == current->record.customer_asn;

		// MARK: Handling 'add' operations
		if (current->type == ASPA_ADD) {
			// Attempt to add record with $CAS, but record with $CAS already exists
			// Error: Duplicate Add.
			if (existing_matches_current) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_DUPLICATE_RECORD;
			}

			// This operation adds a record with $CAS, the next op however removes this $CAS record again.
			if (next_matches_current && next->type == ASPA_REMOVE) {
#if ASPA_NOTIFY_NO_OPS
				// Complete record's providers for clients
				next->record = current->record;
				aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, current->type);
				aspa_table_notify_clients(aspa_table, &next->record, rtr_socket, next->type);
#endif

				// Mark as no-op.
				current->is_no_op = true;
				next->is_no_op = true;

				// Skip next
				i += 1;
				continue;
			}

			// Add record by appending it to new array (copy providers)
			if (aspa_array_insert(array, existing_i, &current->record, true) != ASPA_SUCCESS) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_ERROR;
			}
		}

		// MARK: Handling 'remove' operations
		else if (current->type == ASPA_REMOVE) {
			// Attempt to remove record with $CAS, but record with $CAS does not exist
			// Error: Removal of unknown record.
			if (!existing_matches_current) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_RECORD_NOT_FOUND;
			}

			// If it's a remove operation, we insert a reference to the removed record's providers.
			current->record.provider_count = existing_record->provider_count;
			current->record.provider_asns = existing_record->provider_asns;

			// Remove record (don't release providers)
			if (aspa_array_remove(array, existing_i, false) != ASPA_SUCCESS) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_RECORD_NOT_FOUND;
			}
		}

		// Notify clients
		aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, current->type);
	}

	pthread_rwlock_unlock(&aspa_table->lock);
	return ASPA_SUCCESS;
}